

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O2

mFILE * mfcreate_from(char *path,char *mode_str,FILE *fp)

{
  mFILE *pmVar1;
  
  pmVar1 = mfreopen(path,mode_str,fp);
  if (pmVar1 != (mFILE *)0x0) {
    pmVar1->fp = (FILE *)0x0;
  }
  return pmVar1;
}

Assistant:

mFILE *mfcreate_from(const char *path, const char *mode_str, FILE *fp) {
   mFILE *mf; 

    /* Open using mfreopen() */
    if (NULL == (mf = mfreopen(path, mode_str, fp)))
	return NULL;
    
    /* Disassociate from the input stream */
    mf->fp = NULL;

    return mf;
}